

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp:9760:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2_include_catch2_catch_2_13_10_hpp:9760:37)>
          *this,string *arg)

{
  int iVar1;
  YesOrNo YVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string mode;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_e0);
  local_58 = 0;
  local_60 = &PTR__BasicResult_001a02b8;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  toLower(&local_a0,&local_e0);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
  if (iVar1 == 0) {
    YVar2 = Yes;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
    if (iVar1 == 0) {
      YVar2 = No;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
      if (iVar1 != 0) {
        ::std::operator+(&local_80,"colour mode must be one of: auto, yes or no. \'",&local_e0);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_80);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_b0 = *plVar4;
          uStack_a8 = (undefined4)plVar3[3];
          uStack_a4 = *(undefined4 *)((long)plVar3 + 0x1c);
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar4;
          local_c0 = (long *)*plVar3;
        }
        local_b8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
        super_ResultBase.m_type = RuntimeError;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a02b8;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_errorMessage,local_c0,
                   local_b8 + (long)local_c0);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        goto LAB_00136120;
      }
      YVar2 = Auto;
    }
  }
  ((this->m_lambda).config)->useColour = YVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a02b8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00136120:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_60 = &PTR__BasicResult_001a02b8;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }